

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# week11-hw-solution.cpp
# Opt level: O0

void print<std::__cxx11::list<int,std::allocator<int>>>(list<int,_std::allocator<int>_> *value)

{
  bool bVar1;
  reference piVar2;
  ostream *poVar3;
  int *item;
  const_iterator __end0;
  const_iterator __begin0;
  list<int,_std::allocator<int>_> *__range2;
  list<int,_std::allocator<int>_> *value_local;
  
  __end0 = std::__cxx11::list<int,_std::allocator<int>_>::begin(value);
  item = (int *)std::__cxx11::list<int,_std::allocator<int>_>::end(value);
  while( true ) {
    bVar1 = std::operator==(&__end0,(_Self *)&item);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    piVar2 = std::_List_const_iterator<int>::operator*(&__end0);
    poVar3 = std::operator<<((ostream *)&std::cout,"[");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*piVar2);
    std::operator<<(poVar3,"]");
    std::_List_const_iterator<int>::operator++(&__end0);
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void print(const T& value)
{
    if constexpr(IsContainer<T>)
    {
        for(const auto& item : value)
            std::cout << "[" << item << "]";
        std::cout << std::endl;
    }
    else
    {
        std::cout << value << std::endl;
    }
}